

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall
TPZFMatrix<long>::TimesBetaPlusZ(TPZFMatrix<long> *this,long beta,TPZFMatrix<long> *z)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long *pz;
  long *ptlast;
  long *pt;
  TPZFMatrix<long> *z_local;
  long beta_local;
  TPZFMatrix<long> *this_local;
  
  plVar1 = this->fElem;
  lVar2 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  lVar3 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  pz = z->fElem;
  pt = this->fElem;
  while (pt < plVar1 + lVar2 * lVar3) {
    *pt = beta * *pt;
    *pt = *pz + *pt;
    pz = pz + 1;
    pt = pt + 1;
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::TimesBetaPlusZ(const TVar beta,const TPZFMatrix<TVar> &z) {
    // #ifdef USING_ATLAS
    // 	int size = fRow*fCol;
    // 	cblas_dscal(size,beta,fElem,1);
    // 	cblas_daxpy(size,1.,z.fElem,1,fElem,1);
    // #else
    
    TVar * pt = fElem,  *ptlast = fElem + this->fRow*this->fCol;
    TVar * pz = z.fElem;
    //	while(pt < ptlast) *pt++ *= (beta) + *pz++;
    while(pt < ptlast) {
        *pt *= (beta);
        *pt++ += *pz++;
    }
    // #endif
}